

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O2

bool __thiscall
Future<void>::Private::LockFreeQueue<Future<void>::Private::ThreadPool::Job>::push
          (LockFreeQueue<Future<void>::Private::ThreadPool::Job> *this,Job *data)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  ulong uVar4;
  Node *pNVar5;
  ulong uVar6;
  bool bVar7;
  
  uVar4 = this->_tail;
  do {
    uVar3 = uVar4;
    uVar6 = this->_capacityMask & uVar3;
    uVar1 = this->_queue[uVar6].tail;
    if (uVar1 != uVar3) goto LAB_0010be03;
    LOCK();
    uVar4 = this->_tail;
    bVar7 = uVar3 == uVar4;
    if (bVar7) {
      this->_tail = uVar3 + 1;
      uVar4 = uVar3;
    }
    UNLOCK();
  } while (!bVar7);
  pNVar5 = this->_queue + uVar6;
  pvVar2 = data->args;
  (pNVar5->data).proc = data->proc;
  (pNVar5->data).args = pvVar2;
  LOCK();
  pNVar5->head = uVar3;
  UNLOCK();
LAB_0010be03:
  return uVar1 == uVar3;
}

Assistant:

inline bool Future<void>::Private::LockFreeQueue<T>::push(const T &data)
{
  Node *node;
  usize next, tail = _tail;
  for (;; tail = next)
  {
    node = &_queue[tail & _capacityMask];
    if (node->tail != tail)
      return false;
    if ((next = Atomic::compareAndSwap(_tail, tail, tail + 1)) == tail)
      break;
  }
  new (&node->data) T(data);
  Atomic::swap(node->head, tail);
  return true;
}